

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O0

void __thiscall MyClientConnection::OnConnect(MyClientConnection *this)

{
  TonkStatusEx status;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffb88;
  LogStringBuffer *in_stack_fffffffffffffb90;
  Channel *buffer_00;
  OutputWorker *in_stack_fffffffffffffbd0;
  char acStack_3fe [40];
  ushort local_3d6 [23];
  ushort *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  Channel *local_388;
  ushort *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined4 local_35c;
  Channel *local_358;
  undefined4 local_34c;
  Channel *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  ushort *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined4 local_184;
  Channel *local_180;
  ushort *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined8 local_158;
  undefined1 *local_150;
  Channel *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  Channel *local_130;
  ushort *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  Channel *local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  ushort *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  Channel *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  Channel *local_88;
  ushort *local_80;
  char *local_78;
  undefined1 *local_70;
  Channel *local_68;
  char *local_60;
  undefined1 *local_58;
  char *local_50;
  undefined1 *local_48;
  Channel *local_40;
  ushort *local_38;
  undefined1 *local_30;
  Channel *local_28;
  char *local_20;
  undefined1 *local_18;
  ushort *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffffb90);
  local_398 = acStack_3fe;
  local_3a8 = local_3d6;
  local_388 = &Logger;
  local_390 = "Connected to ";
  local_3a0 = " : ";
  local_358 = &Logger;
  local_35c = 2;
  local_368 = "Connected to ";
  local_378 = " : ";
  buffer_00 = &Logger;
  local_348 = &Logger;
  local_34c = 2;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_180 = &Logger;
    local_184 = 2;
    local_190 = "Connected to ";
    local_1a0 = " : ";
    local_380 = local_3a8;
    local_370 = local_398;
    local_1a8 = local_3a8;
    local_198 = local_398;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,Trace);
    local_158 = 0x118328;
    local_148 = &Logger;
    local_160 = local_190;
    local_168 = local_198;
    local_170 = local_1a0;
    local_178 = local_1a8;
    local_130 = &Logger;
    local_150 = local_330;
    local_140 = local_158;
    local_138 = local_330;
    local_f8 = local_158;
    local_f0 = local_330;
    std::operator<<(aoStack_320,(string *)&Logger.Prefix);
    local_100 = &Logger;
    local_108 = local_150;
    local_110 = local_160;
    local_118 = local_168;
    local_120 = local_170;
    local_128 = local_178;
    local_d8 = &Logger;
    local_e0 = local_150;
    local_e8 = local_160;
    local_a0 = local_150;
    local_a8 = local_160;
    std::operator<<((ostream *)(local_150 + 0x10),local_160);
    local_b0 = &Logger;
    local_b8 = local_108;
    local_c0 = local_118;
    local_c8 = local_120;
    local_d0 = local_128;
    local_88 = &Logger;
    local_90 = local_108;
    local_98 = local_118;
    local_58 = local_108;
    local_60 = local_118;
    std::operator<<((ostream *)(local_108 + 0x10),local_118);
    local_68 = &Logger;
    local_70 = local_b8;
    local_78 = local_c8;
    local_80 = local_d0;
    local_40 = &Logger;
    local_48 = local_b8;
    local_50 = local_c8;
    local_18 = local_b8;
    local_20 = local_c8;
    std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
    local_28 = &Logger;
    local_30 = local_70;
    local_38 = local_80;
    local_8 = local_70;
    local_10 = local_80;
    std::ostream::operator<<((ostream *)(local_70 + 0x10),*local_80);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffbd0,(LogStringBuffer *)buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x103ad0);
  }
  return;
}

Assistant:

void MyClientConnection::OnConnect()
{
    auto status = GetStatusEx();

    Logger.Info("Connected to ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
}